

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_gtest_main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  UnitTest *pUVar3;
  TestEventListeners *this;
  TestEventListener *pTVar4;
  TestEventListener *listener;
  int iVar5;
  char **in_RSI;
  env e;
  comm c;
  env eStack_48;
  comm local_40;
  int local_1c;
  char **local_18;
  
  testing::InitGoogleTest(&local_1c,in_RSI);
  mxx::env::env(&eStack_48,&local_1c,&local_18);
  MPI_Comm_create_errhandler(mxx::my_mpi_errorhandler,&local_40);
  MPI_Comm_set_errhandler(&ompi_mpi_comm_world,local_40._vptr_comm);
  local_40._vptr_comm = (_func_int **)&PTR__comm_00139390;
  local_40.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_size(&ompi_mpi_comm_world);
  MPI_Comm_rank(local_40.mpi_comm);
  local_40.do_free = false;
  if (local_40.m_rank == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running GTEST with MPI using ",0x1d);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40.m_size);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," processes.",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pUVar3 = testing::UnitTest::GetInstance();
  this = testing::UnitTest::listeners(pUVar3);
  pTVar4 = testing::TestEventListeners::Release(this,this->default_result_printer_);
  listener = (TestEventListener *)operator_new(0x18);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_001393c0;
  *(int *)&listener[1]._vptr_TestEventListener = local_40.m_rank;
  listener[2]._vptr_TestEventListener = (_func_int **)pTVar4;
  testing::TestEventListeners::Append(this,listener);
  pUVar3 = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(pUVar3);
  iVar5 = 0;
  if (local_40.m_rank == 0) {
    iVar5 = iVar1;
  }
  mxx::comm::~comm(&local_40);
  mxx::env::~env(&eStack_48);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
    int result = 0;

    ::testing::InitGoogleTest(&argc, argv);

    mxx::env e(argc, argv);
    mxx::env::set_exception_on_error();
    mxx::comm c = mxx::comm();
    //MPI_Init(&argc, &argv);

    if (c.rank() == 0)
      std::cout << "Running GTEST with MPI using " << c.size() << " processes." << std::endl;

    // set up wrapped test listener
    ::testing::TestEventListeners& listeners = ::testing::UnitTest::GetInstance()->listeners();
    ::testing::TestEventListener* default_listener =  listeners.Release(listeners.default_result_printer());
    listeners.Append(new mxx_gtest::MpiTestEventListener(c.rank(), default_listener));

    // running tests
    result = RUN_ALL_TESTS();
    if (c.rank() != 0)
      result = 0;

    // clean up MPI
    //MPI_Finalize();

    // return good status no matter what
    return result;
}